

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_types.hpp
# Opt level: O3

void pstore::serialize::serializer<std::__cxx11::string,void>::
     read<pstore::serialize::archive::database_reader&>(database_reader *archive,value_type *str)

{
  pointer pcVar1;
  size_t size;
  span<char,__1L> span;
  extent_type<_1L> local_40 [2];
  
  (str->_M_dataplus)._M_p = (pointer)&str->field_2;
  str->_M_string_length = 0;
  (str->field_2)._M_local_buf[0] = '\0';
  size = string_helper::read_length<pstore::serialize::archive::database_reader&>(archive);
  std::__cxx11::string::resize((ulong)str,(char)size);
  pcVar1 = (str->_M_dataplus)._M_p;
  gsl::details::extent_type<-1L>::extent_type(local_40,size);
  span.storage_.data_ = pcVar1;
  span.storage_.super_extent_type<_1L>.size_ = local_40[0].size_;
  serialize::archive::database_reader::getn<pstore::gsl::span<char,_1l>,void>(archive,span);
  return;
}

Assistant:

static void read (Archive && archive, value_type & str) {
                // Read the body of the string.
                new (&str) value_type;

                // Deleter will ensure that the string is destroyed on exit if an exception is
                // raised here.
                auto dtor = [] (value_type * const p) {
                    using string = std::string;
                    p->~string ();
                };
                std::unique_ptr<value_type, decltype (dtor)> deleter (&str, dtor);

                auto const length = string_helper::read_length (archive);
                str.resize (length);

#ifdef PSTORE_HAVE_NON_CONST_STD_STRING_DATA
                char * const data = str.data ();
#else
                // TODO: this is technically undefined behaviour. Remove once we've got access to
                // the C++17 library on our platforms.
                auto * const data = const_cast<char *> (str.data ());
#endif
                // Now read the body of the string.
                serialize::read_uninit (
                    archive, gsl::make_span (data, static_cast<std::ptrdiff_t> (length)));

                // Release ownership from the deleter so that the initialized object is returned to
                // the caller.
                deleter.release ();
            }